

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegxParser.cpp
# Opt level: O0

void __thiscall xercesc_4_0::RegxParser::processNext(RegxParser *this)

{
  XMLCh ch_00;
  XMLCh XVar1;
  XMLSize_t XVar2;
  bool bVar3;
  XMLInt32 XVar4;
  ParseException *pPVar5;
  undefined4 *puVar6;
  XMLCh lowCh_1;
  XMLCh lowCh;
  parserState local_14;
  XMLCh ch;
  parserState nextState;
  RegxParser *this_local;
  
  if (this->fOffset < this->fStringLen) {
    XVar2 = this->fOffset;
    this->fOffset = XVar2 + 1;
    ch_00 = this->fString[XVar2];
    this->fCharData = (uint)(ushort)ch_00;
    if (this->fParseContext == regexParserStateInBrackets) {
      if (ch_00 == L'-') {
        if ((this->fOffset < this->fStringLen) && (this->fString[this->fOffset] == L'[')) {
          this->fOffset = this->fOffset + 1;
          local_14 = REGX_T_XMLSCHEMA_CC_SUBTRACTION;
        }
        else {
          local_14 = REGX_T_CHAR;
        }
      }
      else if (ch_00 == L'\\') {
        local_14 = REGX_T_BACKSOLIDUS;
        if (this->fStringLen <= this->fOffset) {
          pPVar5 = (ParseException *)__cxa_allocate_exception(0x30);
          ParseException::ParseException
                    (pPVar5,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/regx/RegxParser.cpp"
                     ,0x93,Parser_Next1,this->fMemoryManager);
          __cxa_throw(pPVar5,&ParseException::typeinfo,ParseException::~ParseException);
        }
        XVar2 = this->fOffset;
        this->fOffset = XVar2 + 1;
        this->fCharData = (uint)(ushort)this->fString[XVar2];
      }
      else {
        bVar3 = RegxUtil::isHighSurrogate(ch_00);
        if ((bVar3) && (this->fOffset < this->fStringLen)) {
          XVar1 = this->fString[this->fOffset];
          bVar3 = RegxUtil::isLowSurrogate(XVar1);
          if (!bVar3) {
            puVar6 = (undefined4 *)__cxa_allocate_exception(4);
            *puVar6 = 0xdf;
            __cxa_throw(puVar6,&XMLErrs::Codes::typeinfo,0);
          }
          XVar4 = RegxUtil::composeFromSurrogate(ch_00,XVar1);
          this->fCharData = XVar4;
          this->fOffset = this->fOffset + 1;
        }
        local_14 = REGX_T_CHAR;
      }
      this->fState = local_14;
    }
    else {
      switch(ch_00) {
      case L'$':
        local_14 = REGX_T_DOLLAR;
        break;
      default:
        local_14 = REGX_T_CHAR;
        bVar3 = RegxUtil::isHighSurrogate(ch_00);
        if ((bVar3) && (this->fOffset < this->fStringLen)) {
          XVar1 = this->fString[this->fOffset];
          bVar3 = RegxUtil::isLowSurrogate(XVar1);
          if (!bVar3) {
            puVar6 = (undefined4 *)__cxa_allocate_exception(4);
            *puVar6 = 0xdf;
            __cxa_throw(puVar6,&XMLErrs::Codes::typeinfo,0);
          }
          XVar4 = RegxUtil::composeFromSurrogate(ch_00,XVar1);
          this->fCharData = XVar4;
          this->fOffset = this->fOffset + 1;
        }
        break;
      case L'(':
        local_14 = REGX_T_LPAREN;
        break;
      case L')':
        local_14 = REGX_T_RPAREN;
        break;
      case L'*':
        local_14 = REGX_T_STAR;
        break;
      case L'+':
        local_14 = REGX_T_PLUS;
        break;
      case L'.':
        local_14 = REGX_T_DOT;
        break;
      case L'?':
        local_14 = REGX_T_QUESTION;
        break;
      case L'[':
        local_14 = REGX_T_LBRACKET;
        break;
      case L'\\':
        local_14 = REGX_T_BACKSOLIDUS;
        if (this->fStringLen <= this->fOffset) {
          pPVar5 = (ParseException *)__cxa_allocate_exception(0x30);
          ParseException::ParseException
                    (pPVar5,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/regx/RegxParser.cpp"
                     ,0xd9,Parser_Next1,this->fMemoryManager);
          __cxa_throw(pPVar5,&ParseException::typeinfo,ParseException::~ParseException);
        }
        XVar2 = this->fOffset;
        this->fOffset = XVar2 + 1;
        this->fCharData = (uint)(ushort)this->fString[XVar2];
        break;
      case L'^':
        local_14 = REGX_T_CARET;
        break;
      case L'|':
        local_14 = REGX_T_OR;
      }
      this->fState = local_14;
    }
  }
  else {
    this->fCharData = -1;
    this->fState = REGX_T_EOF;
  }
  return;
}

Assistant:

void RegxParser::processNext() {

    if (fOffset >= fStringLen) {

        fCharData = -1;
        fState = REGX_T_EOF;
        return;
    }

    parserState nextState;
    XMLCh ch = fString[fOffset++];
    fCharData = ch;

    if (fParseContext == regexParserStateInBrackets) {

        switch (ch) {
        case chBackSlash:
            nextState = REGX_T_BACKSOLIDUS;

            if (fOffset >= fStringLen) {
                ThrowXMLwithMemMgr(ParseException,XMLExcepts::Parser_Next1, fMemoryManager);
            }

            fCharData = fString[fOffset++];
            break;
        case chDash:
            if (fOffset < fStringLen && fString[fOffset] == chOpenSquare) {

                fOffset++;
                nextState = REGX_T_XMLSCHEMA_CC_SUBTRACTION;
            }
            else {
                nextState = REGX_T_CHAR;
            }
            break;
        default:
            if (RegxUtil::isHighSurrogate(ch) && fOffset < fStringLen) {

                XMLCh lowCh = fString[fOffset];
                if (RegxUtil::isLowSurrogate(lowCh)) {
                    fCharData = RegxUtil::composeFromSurrogate(ch, lowCh);
                    fOffset++;
                }
                else {
                    throw XMLErrs::Expected2ndSurrogateChar;
                }
            }

            nextState = REGX_T_CHAR;
        }

        fState = nextState;
        return;
    }

    switch (ch) {

    case chPipe:
        nextState = REGX_T_OR;
        break;
    case chAsterisk:
        nextState = REGX_T_STAR;
        break;
    case chPlus:
        nextState = REGX_T_PLUS;
        break;
    case chQuestion:
        nextState = REGX_T_QUESTION;
        break;
    case chCloseParen:
        nextState = REGX_T_RPAREN;
        break;
    case chPeriod:
        nextState = REGX_T_DOT;
        break;
    case chOpenSquare:
        nextState = REGX_T_LBRACKET;
        break;
    case chCaret:
        nextState = REGX_T_CARET;
        break;
    case chDollarSign:
        nextState = REGX_T_DOLLAR;
        break;
    case chOpenParen:
        nextState = REGX_T_LPAREN;
        break;
    case chBackSlash:
        nextState = REGX_T_BACKSOLIDUS;
        if (fOffset >= fStringLen) {
            ThrowXMLwithMemMgr(ParseException,XMLExcepts::Parser_Next1, fMemoryManager);
        }

        fCharData = fString[fOffset++];
        break;
    default:
        nextState = REGX_T_CHAR;
        if (RegxUtil::isHighSurrogate(ch) && fOffset < fStringLen) {

                XMLCh lowCh = fString[fOffset];
                if (RegxUtil::isLowSurrogate(lowCh)) {
                    fCharData = RegxUtil::composeFromSurrogate(ch, lowCh);
                    fOffset++;
                }
                else {
                    throw XMLErrs::Expected2ndSurrogateChar;
                }
            }
    }

    fState = nextState;
}